

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon.c
# Opt level: O1

void wakeup(monst *mtmp)

{
  mtmp->field_0x62 = mtmp->field_0x62 & 0xf7;
  mtmp->meating = 0;
  setmangry(mtmp);
  if (mtmp->m_ap_type != '\0') {
    seemimic(mtmp);
    return;
  }
  if (((flags.forcefight != '\0') && (flags.mon_moving == '\0')) &&
     ((char)*(uint *)&mtmp->field_0x60 < '\0')) {
    *(uint *)&mtmp->field_0x60 = *(uint *)&mtmp->field_0x60 & 0xffffff7f;
    newsym((int)mtmp->mx,(int)mtmp->my);
    return;
  }
  return;
}

Assistant:

void wakeup(struct monst *mtmp)
{
	mtmp->msleeping = 0;
	mtmp->meating = 0;	/* assume there's no salvagable food left */
	setmangry(mtmp);
	if (mtmp->m_ap_type) seemimic(mtmp);
	else if (flags.forcefight && !flags.mon_moving && mtmp->mundetected) {
	    mtmp->mundetected = 0;
	    newsym(mtmp->mx, mtmp->my);
	}
}